

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O2

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t::process
          (start_of_frame_0_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  pointer __p;
  reference_const_type pbVar1;
  pointer psVar2;
  size_t sVar3;
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::payload_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
  local_28;
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_20;
  
  if (((symbol->super_type).m_initialized != false) &&
     (pbVar1 = boost::optional<bool>::get(symbol), *pbVar1 != true)) {
    sVar3 = this->cnt + 1;
    this->cnt = sVar3;
    if (sVar3 != 4) {
      return;
    }
    psVar2 = (pointer)operator_new(0x30);
    psVar2->_vptr_state_base_t = (_func_int **)&PTR_process_0011ece0;
    psVar2[1]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[2]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[3]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[4]._vptr_state_base_t = (_func_int **)0x0;
    psVar2[5]._vptr_state_base_t = (_func_int **)0x0;
    local_28._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_false>.
    _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
                    )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
                      )0x0;
    local_20._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
    _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                    )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                      )0x0;
    std::
    __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
             *)(ctx + 0x20),psVar2);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                   *)&local_20);
    std::
    unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
    ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::payload_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
                   *)&local_28);
    return;
  }
  psVar2 = (pointer)operator_new(0x10);
  psVar2->_vptr_state_base_t = (_func_int **)&PTR_process_0011ebf0;
  psVar2[1]._vptr_state_base_t = (_func_int **)0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
  .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_false>._M_head_impl
       = (tuple<wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
          )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::payload_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::payload_t>_>
            )0x0;
  local_20._M_t.
  super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
  _M_head_impl = (tuple<wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                  )(_Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                    )0x0;
  std::
  __uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  ::reset((__uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
           *)(ctx + 0x20),psVar2);
  std::
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
                 *)&local_20);
  std::
  unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
  ::~unique_ptr((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t>_>
                 *)&local_28);
  return;
}

Assistant:

void
start_of_frame_0_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (*symbol)
    {
        ctx.state(
          std::unique_ptr<start_of_frame_1_t>(new start_of_frame_1_t()));
    }
    else if (++cnt == 4) // we expect four consecutive '0'
    {
        ctx.state(std::unique_ptr<payload_t>(new payload_t()));
    }
}